

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool generate_wavFile(OpenJTalk *oj,char *txt,FILE *wavfp)

{
  long in_RDI;
  FILE *in_stack_00000400;
  FILE *in_stack_00000408;
  char *in_stack_00000410;
  Open_JTalk *in_stack_00000418;
  _Bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    g_psd->length = 0;
    g_psd->sampling_frequency = 0;
    g_psd->data = (short *)0x0;
    local_1 = Open_JTalk_synthesis
                        (in_stack_00000418,in_stack_00000410,in_stack_00000408,in_stack_00000400);
  }
  return local_1;
}

Assistant:

bool generate_wavFile(OpenJTalk *oj, const char *txt, FILE *wavfp)
{
	if (!oj)
	{
		return false;
	}

	g_psd->length = 0;
	g_psd->sampling_frequency = 0;
	g_psd->data = NULL;

	return Open_JTalk_synthesis(oj->open_jtalk, txt, wavfp, NULL);
}